

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall kj::_::ExceptionOr<kj::OwnFd>::~ExceptionOr(ExceptionOr<kj::OwnFd> *this)

{
  if ((this->value).ptr.isSet == true) {
    OwnFd::~OwnFd(&(this->value).ptr.field_1.value);
  }
  if ((this->super_ExceptionOrValue).exception.ptr.isSet == true) {
    Exception::~Exception(&(this->super_ExceptionOrValue).exception.ptr.field_1.value);
    return;
  }
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}